

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

Bbr_ImageTree_t *
Bbr_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars,
                 int nBddMax,int fVerbose)

{
  int iVar1;
  Bbr_ImageNode_t *pBVar2;
  DdNode *pDVar3;
  int local_70;
  int local_6c;
  int v;
  int fStop;
  Bbr_ImageNode_t *pCare;
  Bbr_ImageNode_t **pNodes;
  Bbr_ImageVar_t **pVars;
  Bbr_ImagePart_t **pParts;
  Bbr_ImageTree_t *pTree;
  DdNode **pbVars_local;
  DdNode **ppDStack_30;
  int nVars_local;
  DdNode **pbParts_local;
  DdNode *pDStack_20;
  int nParts_local;
  DdNode *bCare_local;
  DdManager *dd_local;
  
  pTree = (Bbr_ImageTree_t *)pbVars;
  pbVars_local._4_4_ = nVars;
  ppDStack_30 = pbParts;
  pbParts_local._4_4_ = nParts;
  pDStack_20 = bCare;
  bCare_local = &dd->sentinel;
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    Bbr_bddImagePrintLatchDependency(dd,bCare,nParts,pbParts,nVars,pbVars);
  }
  pVars = (Bbr_ImageVar_t **)
          Bbr_CreateParts((DdManager *)bCare_local,pbParts_local._4_4_,ppDStack_30,pDStack_20);
  pNodes = (Bbr_ImageNode_t **)
           Bbr_CreateVars((DdManager *)bCare_local,pbParts_local._4_4_ + 1,(Bbr_ImagePart_t **)pVars
                          ,pbVars_local._4_4_,(DdNode **)pTree);
  pCare = (Bbr_ImageNode_t *)
          Bbr_CreateNodes((DdManager *)bCare_local,pbParts_local._4_4_ + 1,(Bbr_ImagePart_t **)pVars
                          ,*(int *)&bCare_local[3].type,(Bbr_ImageVar_t **)pNodes);
  _v = (&pCare->dd)[pbParts_local._4_4_];
  do {
    iVar1 = Bbr_BuildTreeNode((DdManager *)bCare_local,pbParts_local._4_4_ + 1,
                              (Bbr_ImageNode_t **)pCare,*(int *)&bCare_local[3].type,
                              (Bbr_ImageVar_t **)pNodes,&local_6c,nBddMax);
  } while (iVar1 != 0);
  if (local_6c == 0) {
    for (local_70 = 0; local_70 < *(int *)&bCare_local[3].type; local_70 = local_70 + 1) {
      if (pNodes[local_70] != (Bbr_ImageNode_t *)0x0) {
        __assert_fail("pVars[v] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0xd3,
                      "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                     );
      }
    }
    if (pNodes != (Bbr_ImageNode_t **)0x0) {
      free(pNodes);
      pNodes = (Bbr_ImageNode_t **)0x0;
    }
    pParts = (Bbr_ImagePart_t **)malloc(0x30);
    memset(pParts,0,0x30);
    pParts[1] = (Bbr_ImagePart_t *)_v;
    *(int *)(pParts + 5) = nBddMax;
    *(int *)(pParts + 3) = fVerbose;
    do {
      pBVar2 = Bbr_MergeTopNodes((DdManager *)bCare_local,pbParts_local._4_4_ + 1,
                                 (Bbr_ImageNode_t **)pCare);
      *pParts = (Bbr_ImagePart_t *)pBVar2;
    } while (pBVar2 == (Bbr_ImageNode_t *)0x0);
    for (local_70 = 0; local_70 < pbParts_local._4_4_ + 1; local_70 = local_70 + 1) {
      if ((&pCare->dd)[local_70] != (DdManager *)0x0) {
        __assert_fail("pNodes[v] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0xe2,
                      "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                     );
      }
    }
    if (pCare != (Bbr_ImageNode_t *)0x0) {
      free(pCare);
      pCare = (Bbr_ImageNode_t *)0x0;
    }
    pDVar3 = Cudd_Support((DdManager *)bCare_local,pDStack_20);
    pParts[2] = (Bbr_ImagePart_t *)pDVar3;
    Cudd_Ref((DdNode *)pParts[2]);
    Bbr_DeleteParts_rec((Bbr_ImageNode_t *)*pParts);
    if (pVars != (Bbr_ImageVar_t **)0x0) {
      free(pVars);
    }
    dd_local = (DdManager *)pParts;
  }
  else {
    for (local_70 = 0; local_70 < *(int *)&bCare_local[3].type; local_70 = local_70 + 1) {
      if ((pNodes[local_70] != (Bbr_ImageNode_t *)0x0) &&
         (pNodes[local_70] != (Bbr_ImageNode_t *)0x0)) {
        free(pNodes[local_70]);
        pNodes[local_70] = (Bbr_ImageNode_t *)0x0;
      }
    }
    if (pNodes != (Bbr_ImageNode_t **)0x0) {
      free(pNodes);
      pNodes = (Bbr_ImageNode_t **)0x0;
    }
    for (local_70 = 0; local_70 <= pbParts_local._4_4_; local_70 = local_70 + 1) {
      if ((&pCare->dd)[local_70] != (DdManager *)0x0) {
        Bbr_DeleteParts_rec((Bbr_ImageNode_t *)(&pCare->dd)[local_70]);
        Bbr_bddImageTreeDelete_rec((Bbr_ImageNode_t *)(&pCare->dd)[local_70]);
      }
    }
    if (pCare != (Bbr_ImageNode_t *)0x0) {
      free(pCare);
      pCare = (Bbr_ImageNode_t *)0x0;
    }
    if (pVars != (Bbr_ImageVar_t **)0x0) {
      free(pVars);
    }
    dd_local = (DdManager *)0x0;
  }
  return (Bbr_ImageTree_t *)dd_local;
}

Assistant:

Bbr_ImageTree_t * Bbr_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int nBddMax, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Bbr_ImageTree_t * pTree;
    Bbr_ImagePart_t ** pParts;
    Bbr_ImageVar_t ** pVars;
    Bbr_ImageNode_t ** pNodes, * pCare;
    int fStop, v;

    if ( fVerbose && dd->size <= 80 )
        Bbr_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Bbr_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Bbr_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Bbr_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    pCare  = pNodes[nParts];

    // process the nodes
    while ( Bbr_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars, &fStop, nBddMax ) );

    // consider the case of BDD node blowup
    if ( fStop )
    {
        for ( v = 0; v < dd->size; v++ )
            if ( pVars[v] )
                ABC_FREE( pVars[v] );
        ABC_FREE( pVars );
        for ( v = 0; v <= nParts; v++ )
            if ( pNodes[v] )
            {
                Bbr_DeleteParts_rec( pNodes[v] );
                Bbr_bddImageTreeDelete_rec( pNodes[v] );
            }
        ABC_FREE( pNodes );
        ABC_FREE( pParts );
        return NULL;
    }

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Bbr_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Bbr_ImageTree_t) );
    pTree->pCare = pCare;
    pTree->nBddMax = nBddMax;
    pTree->fVerbose = fVerbose;

    // merge the topmost nodes
    while ( (pTree->pRoot = Bbr_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Bbr_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Bbr_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );

    return pTree;
}